

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,OpenMDBitSet *bs)

{
  bool bVar1;
  ostream *poVar2;
  char *__s;
  ulong uVar3;
  string val;
  allocator<char> local_51;
  string local_50 [32];
  
  for (uVar3 = 0;
      uVar3 < (ulong)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(bs->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      uVar3 = uVar3 + 1) {
    bVar1 = OpenMDBitSet::operator[](bs,(int)uVar3);
    __s = "false";
    if (bVar1) {
      __s = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_51);
    poVar2 = std::operator<<(os,"OpenMDBitSet[");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"] = ");
    poVar2 = std::operator<<(poVar2,local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_50);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const OpenMDBitSet& bs) {
    for (size_t i = 0; i < bs.bitset_.size(); ++i) {
      std::string val = bs[i] ? "true" : "false";
      os << "OpenMDBitSet[" << i << "] = " << val << std::endl;
    }

    return os;
  }